

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator+=(APInt *this,APInt *RHS)

{
  ulong uVar1;
  uint uVar2;
  uint64_t *puVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  uint64_t *puVar7;
  ulong uVar8;
  APInt *pAVar9;
  ulong uVar10;
  uint i;
  ulong uVar11;
  
  uVar2 = this->BitWidth;
  if (uVar2 != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0xc1,"APInt &llvm::APInt::operator+=(const APInt &)");
  }
  if (uVar2 < 0x41) {
    puVar7 = (uint64_t *)((long)(this->U).pVal + (long)(RHS->U).pVal);
    (this->U).pVal = puVar7;
    pAVar9 = this;
  }
  else {
    puVar7 = (this->U).pVal;
    puVar3 = (RHS->U).pVal;
    uVar8 = (ulong)uVar2 + 0x3f >> 6;
    uVar11 = 0;
    bVar5 = false;
    do {
      uVar4 = puVar7[uVar11];
      uVar10 = puVar3[uVar11] + uVar4;
      uVar1 = uVar10 + 1;
      bVar6 = CARRY8(puVar3[uVar11],uVar4);
      if (bVar5) {
        uVar10 = uVar1;
        bVar6 = uVar1 <= uVar4;
      }
      bVar5 = bVar6;
      puVar7[uVar11] = uVar10;
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
    pAVar9 = (APInt *)((this->U).pVal + ((int)uVar8 - 1));
    puVar7 = (uint64_t *)(pAVar9->U).VAL;
  }
  (pAVar9->U).VAL = (ulong)((long)puVar7 << (-(char)uVar2 & 0x3fU)) >> (-(char)uVar2 & 0x3fU);
  return this;
}

Assistant:

APInt& APInt::operator+=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    U.VAL += RHS.U.VAL;
  else
    tcAdd(U.pVal, RHS.U.pVal, 0, getNumWords());
  return clearUnusedBits();
}